

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputDCTDecodeStream.cpp
# Opt level: O0

LongBufferSizeType __thiscall
InputDCTDecodeStream::Read
          (InputDCTDecodeStream *this,Byte *inBuffer,LongBufferSizeType inBufferSize)

{
  EStatusCode EVar1;
  JDIMENSION JVar2;
  bool bVar3;
  HummusJPGException anon_var_0;
  Byte *local_30;
  Byte *indexInBuffer;
  LongBufferSizeType inBufferSize_local;
  Byte *inBuffer_local;
  InputDCTDecodeStream *this_local;
  
  if ((this->mIsDecoding & 1U) == 0) {
    this_local = (InputDCTDecodeStream *)0x0;
  }
  else if (((this->mIsHeaderRead & 1U) == 0) && (EVar1 = StartRead(this), EVar1 != eSuccess)) {
    this_local = (InputDCTDecodeStream *)0x0;
  }
  else {
    local_30 = CopySamplesArrayToBuffer(this,inBuffer,inBufferSize);
    while( true ) {
      bVar3 = false;
      if ((ulong)((long)local_30 - (long)inBuffer) < inBufferSize) {
        bVar3 = (this->mJPGState).output_scanline < (this->mJPGState).output_height;
      }
      if (!bVar3) break;
      JVar2 = jpeg_read_scanlines(&this->mJPGState,this->mSamplesBuffer,
                                  (this->mJPGState).rec_outbuf_height);
      this->mTotalSampleRows = (ulong)JVar2;
      this->mIndexInRow = 0;
      this->mCurrentSampleRow = 0;
      local_30 = CopySamplesArrayToBuffer
                           (this,local_30,inBufferSize - ((long)local_30 - (long)inBuffer));
    }
    this_local = (InputDCTDecodeStream *)(local_30 + -(long)inBuffer);
  }
  return (LongBufferSizeType)this_local;
}

Assistant:

LongBufferSizeType InputDCTDecodeStream::Read(
                                                Byte* inBuffer,
                                                LongBufferSizeType inBufferSize)
{
	if(!mIsDecoding)
		return 0;
    
    if(!mIsHeaderRead)
    {
        if(StartRead() != eSuccess)
            return 0;
    }

    Byte* indexInBuffer = inBuffer;
    
    // fill buffer with what remains from samples buffer
    indexInBuffer = CopySamplesArrayToBuffer(inBuffer,inBufferSize);
 
    // if not satisfied, loop by reading more samples, and filling the buffer.
    // if while reading for samples encountered end of filter, stop
    while(((LongBufferSizeType)(indexInBuffer - inBuffer) < inBufferSize) && (mJPGState.output_scanline < mJPGState.output_height))
    {
        try
        {
            mTotalSampleRows = jpeg_read_scanlines(&mJPGState, mSamplesBuffer, mJPGState.rec_outbuf_height);
        }
        catch(HummusJPGException)
        {
            TRACE_LOG("InputDCTDecodeStream::Read, caught exception in jpg decoding");
            mTotalSampleRows = 0;
        }
        mIndexInRow = 0;
        mCurrentSampleRow = 0;
        indexInBuffer = CopySamplesArrayToBuffer(indexInBuffer,inBufferSize - (indexInBuffer - inBuffer));
    }
    return indexInBuffer - inBuffer;
}